

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O1

CURLSHcode Curl_share_unlock(Curl_easy *data,curl_lock_data type)

{
  Curl_share *pCVar1;
  CURLSHcode CVar2;
  
  pCVar1 = data->share;
  if (pCVar1 == (Curl_share *)0x0) {
    CVar2 = CURLSHE_INVALID;
  }
  else {
    CVar2 = CURLSHE_OK;
    if (((pCVar1->specifier >> (type & 0x1f) & 1) != 0) &&
       (CVar2 = CURLSHE_OK, pCVar1->unlockfunc != (curl_unlock_function)0x0)) {
      (*pCVar1->unlockfunc)(data,type,pCVar1->clientdata);
    }
  }
  return CVar2;
}

Assistant:

CURLSHcode
Curl_share_unlock(struct Curl_easy *data, curl_lock_data type)
{
  struct Curl_share *share = data->share;

  if(!share)
    return CURLSHE_INVALID;

  if(share->specifier & (unsigned int)(1<<type)) {
    if(share->unlockfunc) /* only call this if set! */
      share->unlockfunc (data, type, share->clientdata);
  }

  return CURLSHE_OK;
}